

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

int Abc_SuppSolve(Vec_Wrd_t *p,int nVars)

{
  uint uVar1;
  int iVar;
  abctime aVar2;
  Vec_Wrd_t *p_00;
  Vec_Wec_t *pS;
  Vec_Wec_t *pD;
  int *pCounts;
  word wVar3;
  abctime aVar4;
  abctime time;
  int iVar5;
  long lVar6;
  Vec_Wrd_t *pVVar7;
  ulong uVar8;
  ulong uVar9;
  
  aVar2 = Abc_Clock();
  pVVar7 = p;
  p_00 = Vec_WrdDup(p);
  iVar5 = (int)pVVar7;
  pS = Vec_WecStart(iVar5);
  pD = Vec_WecStart(iVar5);
  uVar8 = (ulong)p->nSize;
  pCounts = (int *)malloc(uVar8 << 2);
  lVar6 = 0;
  uVar9 = 0;
  if (0 < nVars) {
    uVar9 = (ulong)(uint)nVars;
  }
  for (; lVar6 < (int)uVar8; lVar6 = lVar6 + 1) {
    iVar5 = (int)lVar6;
    wVar3 = Vec_WrdEntry(p,iVar5);
    uVar8 = wVar3 - (wVar3 >> 1 & 0x5555555555555555);
    uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
    uVar8 = ((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
    uVar1 = (uint)(byte)(uVar8 >> 0x38);
    pCounts[lVar6] = uVar1;
    if (uVar8 >> 0x38 == 1) {
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        if ((wVar3 >> (uVar8 & 0x3f) & 1) != 0) {
          Vec_WecPush(pS,(int)uVar8,iVar5);
        }
      }
    }
    else if (uVar1 == 2) {
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        if ((wVar3 >> (uVar8 & 0x3f) & 1) != 0) {
          Vec_WecPush(pD,(int)uVar8,iVar5);
        }
      }
    }
    uVar8 = (ulong)(uint)p->nSize;
  }
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x816bba,(char *)(aVar4 - aVar2),time);
  iVar5 = nVars;
  while( true ) {
    iVar = Abc_SuppFindVar(pS,pD,nVars);
    if (iVar == -1) break;
    Abc_SuppRemove(p_00,pCounts,pS,pD,iVar,nVars);
    iVar5 = iVar5 + -1;
  }
  Vec_WecFree(pS);
  Vec_WecFree(pD);
  Vec_WrdFree(p_00);
  free(pCounts);
  return iVar5;
}

Assistant:

int Abc_SuppSolve( Vec_Wrd_t * p, int nVars )
{
    abctime clk = Abc_Clock();
    Vec_Wrd_t * pNew = Vec_WrdDup( p );
    Vec_Wec_t * vSingles = Vec_WecStart( 64 );
    Vec_Wec_t * vDoubles = Vec_WecStart( 64 );
    word Entry; int i, v, iVar, nVarsNew = nVars;
    int * pCounts = ABC_ALLOC( int, Vec_WrdSize(p) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        pCounts[i] = Abc_SuppCountOnes64( Entry );
        if ( pCounts[i] == 1 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( vSingles, v, i );
        }
        else if ( pCounts[i] == 2 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( vDoubles, v, i );
        }
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_SuppProfile( vSingles, vDoubles, nVars );
    // find variable in 0 singles and the smallest doubles
    while ( 1 )
    {
        iVar = Abc_SuppFindVar( vSingles, vDoubles, nVars );
        if ( iVar == -1 )
            break;
//        printf( "Selected variable %d.\n", iVar );
        Abc_SuppRemove( pNew, pCounts, vSingles, vDoubles, iVar, nVars );
//        Abc_SuppProfile( vSingles, vDoubles, nVars );
        nVarsNew--;
    }
//    printf( "Result = %d (out of %d)\n", nVarsNew, nVars );
    Vec_WecFree( vSingles );
    Vec_WecFree( vDoubles );
    Vec_WrdFree( pNew );
    ABC_FREE( pCounts );
    return nVarsNew;
}